

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O1

void __thiscall
slang::ast::ConstraintList::serializeTo(ConstraintList *this,ASTSerializer *serializer)

{
  size_t sVar1;
  pointer ppCVar2;
  long lVar3;
  string_view name;
  
  name._M_str = "list";
  name._M_len = 4;
  ASTSerializer::startArray(serializer,name);
  sVar1 = (this->list)._M_extent._M_extent_value;
  if (sVar1 != 0) {
    ppCVar2 = (this->list)._M_ptr;
    lVar3 = 0;
    do {
      ASTSerializer::serialize(serializer,*(Constraint **)((long)ppCVar2 + lVar3));
      lVar3 = lVar3 + 8;
    } while (sVar1 << 3 != lVar3);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void ConstraintList::serializeTo(ASTSerializer& serializer) const {
    serializer.startArray("list");
    for (auto constraint : list) {
        serializer.serialize(*constraint);
    }
    serializer.endArray();
}